

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodeframe_utils.c
# Opt level: O1

void av1_reset_simple_motion_tree_partition(SIMPLE_MOTION_DATA_TREE *sms_tree,BLOCK_SIZE bsize)

{
  bool bVar1;
  long lVar2;
  BLOCK_SIZE bsize_00;
  int idx;
  
  if (sms_tree == (SIMPLE_MOTION_DATA_TREE *)0x0) {
    return;
  }
  sms_tree->partitioning = '\0';
  if (bsize < BLOCK_8X8) {
    return;
  }
  switch(bsize) {
  case BLOCK_8X8:
    lVar2 = 1;
    break;
  case BLOCK_8X16:
  case BLOCK_16X8:
  case BLOCK_16X32:
  case BLOCK_32X16:
switchD_001a81bb_caseD_4:
    lVar2 = 6;
    bVar1 = true;
    goto LAB_001a81f3;
  case BLOCK_16X16:
    lVar2 = 2;
    break;
  case BLOCK_32X32:
    lVar2 = 3;
    break;
  default:
    if (bsize == BLOCK_64X64) {
      lVar2 = 4;
    }
    else {
      if (bsize != BLOCK_128X128) goto switchD_001a81bb_caseD_4;
      lVar2 = 5;
    }
  }
  bVar1 = false;
LAB_001a81f3:
  bsize_00 = BLOCK_INVALID;
  if (!bVar1) {
    bsize_00 = subsize_lookup[3][lVar2];
  }
  lVar2 = 0;
  do {
    av1_reset_simple_motion_tree_partition(sms_tree->split[lVar2],bsize_00);
    lVar2 = lVar2 + 1;
  } while (lVar2 != 4);
  return;
}

Assistant:

void av1_reset_simple_motion_tree_partition(SIMPLE_MOTION_DATA_TREE *sms_tree,
                                            BLOCK_SIZE bsize) {
  if (sms_tree == NULL) return;
  sms_tree->partitioning = PARTITION_NONE;

  if (bsize >= BLOCK_8X8) {
    BLOCK_SIZE subsize = get_partition_subsize(bsize, PARTITION_SPLIT);
    for (int idx = 0; idx < 4; ++idx)
      av1_reset_simple_motion_tree_partition(sms_tree->split[idx], subsize);
  }
}